

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O2

int getCursorPosition(int ifd,int ofd)

{
  long lVar1;
  int iVar2;
  ssize_t sVar3;
  long lVar4;
  int iVar5;
  int cols;
  int rows;
  char buf [32];
  
  sVar3 = write(1,"\x1b[6n",4);
  iVar5 = -1;
  if (sVar3 == 4) {
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      if ((lVar4 == 0x1f) || (sVar3 = read(0,buf + lVar4,1), sVar3 != 1)) break;
      lVar1 = lVar4 + 1;
    } while (buf[lVar4] != 'R');
    buf[lVar4] = '\0';
    if (((buf[0] == '\x1b') && (buf[1] == '[')) &&
       (iVar2 = __isoc99_sscanf(buf + 2,"%d;%d",&rows,&cols), iVar5 = cols, iVar2 != 2)) {
      iVar5 = -1;
    }
  }
  return iVar5;
}

Assistant:

static int getCursorPosition(int ifd, int ofd) {
    char buf[32];
    int cols, rows;
    unsigned int i = 0;

    /* Report cursor location */
    if (write(ofd, "\x1b[6n", 4) != 4) return -1;

    /* Read the response: ESC [ rows ; cols R */
    while (i < sizeof(buf)-1) {
        if (read(ifd,buf+i,1) != 1) break;
        if (buf[i] == 'R') break;
        i++;
    }
    buf[i] = '\0';

    /* Parse it. */
    if (buf[0] != ESC || buf[1] != '[') return -1;
    if (sscanf(buf+2,"%d;%d",&rows,&cols) != 2) return -1;
    return cols;
}